

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tilt-estimator.cpp
# Opt level: O1

void __thiscall
stateObservation::TiltEstimator::TiltEstimator
          (TiltEstimator *this,double alpha,double beta,double gamma)

{
  ZeroDelayObserver::ZeroDelayObserver(&this->super_ZeroDelayObserver,9,6,0);
  (this->super_ZeroDelayObserver).super_ObserverBase._vptr_ObserverBase =
       (_func_int **)&PTR__ZeroDelayObserver_001b4ba8;
  this->alpha_ = alpha;
  this->beta_ = beta;
  this->gamma_ = gamma;
  this->dt_ = 0.005;
  (this->p_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->p_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->p_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 1.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 1.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  (this->R_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 1.0;
  (this->v_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->v_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->v_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->w_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->w_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->w_S_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  (this->v_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.0;
  (this->v_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = 0.0;
  (this->v_C_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = 0.0;
  return;
}

Assistant:

TiltEstimator::TiltEstimator(double alpha, double beta, double gamma)
: ZeroDelayObserver(9, 6), alpha_(alpha), beta_(beta), gamma_(gamma), dt_(0.005), p_S_C_(Vector3::Zero()),
  R_S_C_(Matrix3::Identity()), v_S_C_(Vector3::Zero()), w_S_C_(Vector3::Zero()), v_C_(Vector3::Zero())
{
}